

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O1

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::push_back
          (packed_gamma_file3<unsigned_int,_6UL> *this,uint64_t x)

{
  iterator iVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  uint local_18;
  uint local_14;
  undefined1 auVar11 [16];
  undefined1 auVar14 [32];
  
  local_14 = (uint)x;
  iVar1._M_current =
       (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->buffer,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = local_14;
    (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  puVar2 = (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  uVar7 = lVar8 >> 2;
  if ((uVar7 * -0x5555555555555555 >> 1 | uVar7 * -0x5555555555555555 << 0x3f) < 0x2aaaaaaaaaaaaaab)
  {
    uVar5 = 0;
    if (5 < uVar7) {
      uVar6 = 0;
      uVar9 = (uVar7 - 5) - uVar7;
      if (uVar7 - 5 < uVar7) {
        uVar9 = uVar6;
      }
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar13[8] = 0x40;
      auVar13._0_8_ = 0x4040404040404040;
      auVar13[9] = 0x40;
      auVar13[10] = 0x40;
      auVar13[0xb] = 0x40;
      auVar13[0xc] = 0x40;
      auVar13[0xd] = 0x40;
      auVar13[0xe] = 0x40;
      auVar13[0xf] = 0x40;
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar19 = auVar18;
        auVar18 = vpbroadcastq_avx512f();
        auVar18 = vporq_avx512f(auVar18,auVar17);
        uVar7 = vpcmpuq_avx512f(auVar18,auVar16,2);
        auVar14 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                      ((long)puVar2 + uVar6 * 4 + lVar8 + -0x18));
        auVar15._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar14._4_4_;
        auVar15._0_4_ = (uint)((byte)uVar7 & 1) * auVar14._0_4_;
        auVar15._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar14._8_4_;
        auVar15._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar14._12_4_;
        auVar15._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar14._16_4_;
        auVar15._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar14._20_4_;
        auVar15._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar14._24_4_;
        auVar15._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar14._28_4_;
        auVar18 = vpmovzxdq_avx512f(auVar15);
        auVar18 = vplzcntq_avx512cd(auVar18);
        auVar10 = vpmovqb_avx512f(auVar18);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar10._0_8_;
        auVar10 = vpsubb_avx(auVar13,auVar11);
        uVar4 = vptestnmd_avx512vl(auVar15,auVar15);
        auVar11 = vpbroadcastb_avx512vl(ZEXT116(1));
        bVar3 = (bool)((byte)uVar4 & 1);
        auVar12[0] = bVar3 * auVar11[0] | !bVar3 * auVar10[0];
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar12[1] = bVar3 * auVar11[1] | !bVar3 * auVar10[1];
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar12[2] = bVar3 * auVar11[2] | !bVar3 * auVar10[2];
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar12[3] = bVar3 * auVar11[3] | !bVar3 * auVar10[3];
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar12[4] = bVar3 * auVar11[4] | !bVar3 * auVar10[4];
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar12[5] = bVar3 * auVar11[5] | !bVar3 * auVar10[5];
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar12[6] = bVar3 * auVar11[6] | !bVar3 * auVar10[6];
        bVar3 = SUB81(uVar4 >> 7,0);
        auVar12[7] = bVar3 * auVar11[7] | !bVar3 * auVar10[7];
        auVar12[8] = auVar10[8];
        auVar12[9] = auVar10[9];
        auVar12[10] = auVar10[10];
        auVar12[0xb] = auVar10[0xb];
        auVar12[0xc] = auVar10[0xc];
        auVar12[0xd] = auVar10[0xd];
        auVar12[0xe] = auVar10[0xe];
        auVar12[0xf] = auVar10[0xf];
        auVar10 = vpmaxub_avx(auVar19._0_16_,auVar12);
        uVar6 = uVar6 + 8;
        auVar18 = ZEXT1664(auVar10);
      } while ((uVar9 + 0xd & 0xfffffffffffffff8) != uVar6);
      auVar13 = vmovdqu8_avx512vl(auVar10);
      bVar3 = (bool)((byte)uVar7 & 1);
      auVar10[0] = bVar3 * auVar13[0] | !bVar3 * auVar19[0];
      bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar10[1] = bVar3 * auVar13[1] | !bVar3 * auVar19[1];
      bVar3 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar10[2] = bVar3 * auVar13[2] | !bVar3 * auVar19[2];
      bVar3 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar10[3] = bVar3 * auVar13[3] | !bVar3 * auVar19[3];
      bVar3 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar10[4] = bVar3 * auVar13[4] | !bVar3 * auVar19[4];
      bVar3 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar10[5] = bVar3 * auVar13[5] | !bVar3 * auVar19[5];
      bVar3 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar10[6] = bVar3 * auVar13[6] | !bVar3 * auVar19[6];
      bVar3 = SUB81(uVar7 >> 7,0);
      auVar10[7] = bVar3 * auVar13[7] | !bVar3 * auVar19[7];
      auVar10[8] = auVar19[8];
      auVar10[9] = auVar19[9];
      auVar10[10] = auVar19[10];
      auVar10[0xb] = auVar19[0xb];
      auVar10[0xc] = auVar19[0xc];
      auVar10[0xd] = auVar19[0xd];
      auVar10[0xe] = auVar19[0xe];
      auVar10[0xf] = auVar19[0xf];
      auVar13 = vpshufd_avx(auVar10,0x55);
      auVar13 = vpmaxub_avx(auVar10,auVar13);
      auVar10 = vpsrld_avx(auVar13,0x10);
      auVar13 = vpmaxub_avx(auVar13,auVar10);
      auVar10 = vpsrlw_avx(auVar13,8);
      auVar13 = vpmaxub_avx(auVar13,auVar10);
      uVar5 = (uint)auVar13[0];
    }
    _local_18 = CONCAT44(local_14,uVar5);
    iVar1._M_current =
         (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->blocks_bitsizes,iVar1,&local_18);
    }
    else {
      *iVar1._M_current = uVar5;
      (this->blocks_bitsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  lVar8 = 1;
  if (x != 0) {
    lVar8 = 0x40 - LZCOUNT(x);
  }
  this->lower_bound_bitsize = this->lower_bound_bitsize + lVar8;
  return;
}

Assistant:

void push_back(uint64_t x){

		assert(write);

		buffer.push_back(x);

		if(buffer.size()%block_size == 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=buffer.size()-block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		lower_bound_bitsize += wd(x);


	}